

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineFunction::~SubroutineFunction(SubroutineFunction *this)

{
  SubroutineFunction *this_local;
  
  std::__cxx11::string::~string((string *)&this->name);
  UniformValue::~UniformValue(&this->embeddedRetVal);
  return;
}

Assistant:

SubroutineFunction(UniformValueGenerator& generator, Index _index = Index::Implicit())
		: index(_index), embeddedRetVal(GL_FLOAT_VEC4, generator)
	{
	}